

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBuffer.hpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLBuffer::append(XMLBuffer *this,XMLCh *chars)

{
  XMLSize_t extraNeeded;
  XMLSize_t XVar1;
  
  if ((chars != (XMLCh *)0x0) && (*chars != L'\0')) {
    XVar1 = 0;
    do {
      extraNeeded = XVar1;
      XVar1 = extraNeeded + 1;
    } while (chars[extraNeeded] != L'\0');
    XVar1 = this->fIndex;
    if (this->fCapacity <= XVar1 + extraNeeded) {
      ensureCapacity(this,extraNeeded);
      XVar1 = this->fIndex;
    }
    memcpy(this->fBuffer + XVar1,chars,extraNeeded * 2);
    this->fIndex = this->fIndex + extraNeeded;
  }
  return;
}

Assistant:

void append (const XMLCh* const chars)
    {
        if (chars != 0 && *chars != 0) {
            // get length of chars
            XMLSize_t count = 0;
            for (; *(chars+count); count++ ) /*noop*/;

            if (fIndex + count >= fCapacity) {
                ensureCapacity(count);
            }
            memcpy(&fBuffer[fIndex], chars, count * sizeof(XMLCh));
            fIndex += count;
        }
    }